

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

void __thiscall QAbstractItemView::dragMoveEvent(QAbstractItemView *this,QDragMoveEvent *event)

{
  QRect *pQVar1;
  QAbstractItemViewPrivate *this_00;
  bool bVar2;
  DragDropMode DVar3;
  DropIndicatorPosition DVar4;
  QPoint QVar5;
  QPoint QVar6;
  QAbstractItemView *pQVar7;
  QWidget *pQVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  undefined1 auVar10 [16];
  QModelIndex local_78;
  QPoint local_60;
  QPoint local_58;
  int iStack_50;
  int iStack_4c;
  undefined8 local_48;
  undefined1 *puStack_40;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemViewPrivate **)(this + 8);
  local_48 = *(undefined1 **)(event + 0x10);
  puStack_40 = *(undefined1 **)(event + 0x18);
  QVar5 = QPointF::toPoint((QPointF *)&local_48);
  QVar6 = QAbstractItemViewPrivate::offset(this_00);
  this_00->draggedPosition =
       (QPoint)((ulong)(uint)(QVar6.xp.m_i.m_i + QVar5.xp.m_i.m_i) |
               ((ulong)QVar6 & 0xffffffff00000000) + (long)QVar5 & 0xffffffff00000000);
  DVar3 = dragDropMode(this);
  if ((DVar3 == InternalMove) &&
     ((pQVar7 = (QAbstractItemView *)QDropEvent::source(), pQVar7 != this ||
      (((byte)event[0x28] & 2) == 0)))) goto LAB_004e4153;
  event[0xc] = (QDragMoveEvent)0x0;
  local_38.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = *(undefined8 *)(event + 0x10);
  local_78.i = *(quintptr *)(event + 0x18);
  QVar5 = QPointF::toPoint((QPointF *)&local_78);
  local_58.xp = QVar5.xp.m_i;
  local_58.yp = QVar5.yp.m_i;
  (**(code **)(*(long *)this + 0x1f0))((QModelIndex *)&local_48,this);
  QPersistentModelIndex::operator=(&this_00->hover,(QModelIndex *)&local_48);
  bVar2 = QAbstractItemViewPrivate::droppingOnItself
                    (this_00,(QDropEvent *)event,(QModelIndex *)&local_48);
  if ((!bVar2) && (bVar2 = QAbstractItemViewPrivate::canDrop(this_00,(QDropEvent *)event), bVar2)) {
    if (((((int)local_48 < 0) || ((long)local_48 < 0)) ||
        (local_38.ptr == (QAbstractItemModel *)0x0)) || (this_00->showDropIndicator != true)) {
      (this_00->dropIndicatorRect).x1 = 0;
      (this_00->dropIndicatorRect).y1 = 0;
      (this_00->dropIndicatorRect).x2 = -1;
      (this_00->dropIndicatorRect).y2 = -1;
      this_00->dropIndicatorPosition = OnViewport;
LAB_004e40e9:
      rootIndex(&local_78,this);
      uVar9 = (**(code **)(*(long *)this_00->model + 0x138))(this_00->model,&local_78);
      if ((uVar9 & 8) != 0) {
LAB_004e410e:
        *(undefined4 *)(event + 0x2c) = *(undefined4 *)(event + 0x30);
        event[0xc] = (QDragMoveEvent)0x1;
      }
    }
    else {
      auVar10 = (**(code **)(*(long *)this + 0x1e0))(this,&local_48);
      local_58.xp.m_i = auVar10._0_4_;
      local_58.yp.m_i = auVar10._4_4_;
      iStack_50 = auVar10._8_4_;
      iStack_4c = auVar10._12_4_;
      local_78._0_8_ = *(undefined8 *)(event + 0x10);
      local_78.i = *(quintptr *)(event + 0x18);
      local_60 = QPointF::toPoint((QPointF *)&local_78);
      DVar4 = (**(code **)(*(long *)&(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate
                                     .super_QWidgetPrivate + 0x120))
                        (this_00,&local_60,&local_58,&local_48);
      this_00->dropIndicatorPosition = DVar4;
      if (((this_00->selectionBehavior == SelectRows) && (DVar4 != OnViewport)) &&
         ((DVar4 != OnItem || (pQVar7 = (QAbstractItemView *)QDropEvent::source(), pQVar7 == this)))
         ) {
        if (0 < local_48._4_4_) {
          QModelIndex::siblingAtColumn(&local_78,(QModelIndex *)&local_48,0);
          auVar10 = (**(code **)(*(long *)this + 0x1e0))(this,&local_78);
          local_58.xp.m_i = auVar10._0_4_;
          local_58.yp.m_i = auVar10._4_4_;
          iStack_50 = auVar10._8_4_;
          iStack_4c = auVar10._12_4_;
        }
        pQVar8 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
        iStack_50 = ~(pQVar8->data->crect).x1.m_i + (pQVar8->data->crect).x2.m_i;
      }
      switch(this_00->dropIndicatorPosition) {
      case OnItem:
        uVar9 = (**(code **)(*(long *)this_00->model + 0x138))(this_00->model,&local_48);
        pQVar1 = &this_00->dropIndicatorRect;
        if ((uVar9 & 8) != 0) {
          pQVar1->x1 = (Representation)local_58.xp.m_i;
          pQVar1->y1 = (Representation)local_58.yp.m_i;
          (this_00->dropIndicatorRect).x2 = (Representation)iStack_50;
          (this_00->dropIndicatorRect).y2 = (Representation)iStack_4c;
          goto LAB_004e410e;
        }
        pQVar1->x1 = 0;
        pQVar1->y1 = 0;
        (this_00->dropIndicatorRect).x2 = -1;
        (this_00->dropIndicatorRect).y2 = -1;
        break;
      case AboveItem:
        QModelIndex::parent(&local_78,(QModelIndex *)&local_48);
        uVar9 = (**(code **)(*(long *)this_00->model + 0x138))(this_00->model,&local_78);
        if ((uVar9 & 8) != 0) {
          (this_00->dropIndicatorRect).x1.m_i = local_58.xp.m_i;
          (this_00->dropIndicatorRect).y1 = (Representation)local_58.yp.m_i;
          (this_00->dropIndicatorRect).x2 = (Representation)iStack_50;
          (this_00->dropIndicatorRect).y2.m_i = local_58.yp.m_i + -1;
          goto LAB_004e410e;
        }
LAB_004e4206:
        (this_00->dropIndicatorRect).x1 = 0;
        (this_00->dropIndicatorRect).y1 = 0;
        (this_00->dropIndicatorRect).x2 = -1;
        (this_00->dropIndicatorRect).y2 = -1;
        break;
      case BelowItem:
        QModelIndex::parent(&local_78,(QModelIndex *)&local_48);
        uVar9 = (**(code **)(*(long *)this_00->model + 0x138))(this_00->model,&local_78);
        if ((uVar9 & 8) == 0) goto LAB_004e4206;
        (this_00->dropIndicatorRect).x1.m_i = local_58.xp.m_i;
        (this_00->dropIndicatorRect).y1.m_i = iStack_4c;
        (this_00->dropIndicatorRect).x2.m_i = iStack_50;
        (this_00->dropIndicatorRect).y2.m_i = iStack_4c + -1;
        goto LAB_004e410e;
      case OnViewport:
        (this_00->dropIndicatorRect).x1 = 0;
        (this_00->dropIndicatorRect).y1 = 0;
        (this_00->dropIndicatorRect).x2 = -1;
        (this_00->dropIndicatorRect).y2 = -1;
        goto LAB_004e40e9;
      }
    }
    QWidget::update((this_00->super_QAbstractScrollAreaPrivate).viewport);
  }
  local_78._0_8_ = *(undefined8 *)(event + 0x10);
  local_78.i = *(quintptr *)(event + 0x18);
  QVar5 = QPointF::toPoint((QPointF *)&local_78);
  local_58.xp = QVar5.xp.m_i;
  local_58.yp = QVar5.yp.m_i;
  bVar2 = QAbstractItemViewPrivate::shouldAutoScroll(this_00,&local_58);
  if (bVar2) {
    startAutoScroll(this);
  }
LAB_004e4153:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemView::dragMoveEvent(QDragMoveEvent *event)
{
    Q_D(QAbstractItemView);
    d->draggedPosition = event->position().toPoint() + d->offset();
    if (dragDropMode() == InternalMove
        && (event->source() != this || !(event->possibleActions() & Qt::MoveAction)))
        return;

    // ignore by default
    event->ignore();

    QModelIndex index = indexAt(event->position().toPoint());
    d->hover = index;
    if (!d->droppingOnItself(event, index)
        && d->canDrop(event)) {

        if (index.isValid() && d->showDropIndicator) {
            QRect rect = visualRect(index);
            d->dropIndicatorPosition = d->position(event->position().toPoint(), rect, index);
            if (d->selectionBehavior == QAbstractItemView::SelectRows
                && d->dropIndicatorPosition != OnViewport
                && (d->dropIndicatorPosition != OnItem || event->source() == this)) {
                if (index.column() > 0)
                    rect = visualRect(index.siblingAtColumn(0));
                rect.setWidth(viewport()->width() - 1 - rect.x());
            }
            switch (d->dropIndicatorPosition) {
            case AboveItem:
                if (d->isIndexDropEnabled(index.parent())) {
                    d->dropIndicatorRect = QRect(rect.left(), rect.top(), rect.width(), 0);
                    event->acceptProposedAction();
                } else {
                    d->dropIndicatorRect = QRect();
                }
                break;
            case BelowItem:
                if (d->isIndexDropEnabled(index.parent())) {
                    d->dropIndicatorRect = QRect(rect.left(), rect.bottom(), rect.width(), 0);
                    event->acceptProposedAction();
                } else {
                    d->dropIndicatorRect = QRect();
                }
                break;
            case OnItem:
                if (d->isIndexDropEnabled(index)) {
                    d->dropIndicatorRect = rect;
                    event->acceptProposedAction();
                } else {
                    d->dropIndicatorRect = QRect();
                }
                break;
            case OnViewport:
                d->dropIndicatorRect = QRect();
                if (d->isIndexDropEnabled(rootIndex())) {
                    event->acceptProposedAction(); // allow dropping in empty areas
                }
                break;
            }
        } else {
            d->dropIndicatorRect = QRect();
            d->dropIndicatorPosition = OnViewport;
            if (d->isIndexDropEnabled(rootIndex())) {
                event->acceptProposedAction(); // allow dropping in empty areas
            }
        }
        d->viewport->update();
    } // can drop

    if (d->shouldAutoScroll(event->position().toPoint()))
        startAutoScroll();
}